

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O1

char * uplevel(void)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  
  __s = pathname;
  if (pathname == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    sVar1 = strlen(pathname);
    lVar4 = (long)(int)sVar1;
    do {
      lVar4 = lVar4 + -1;
      if (__s + lVar4 <= __s) goto LAB_001045f0;
    } while (__s[lVar4] != '/');
    __s[lVar4] = '\0';
LAB_001045f0:
    if (lVar4 == 0) {
      free(__s);
      pcVar3 = (char *)0x0;
      pathname = pcVar3;
    }
    else {
      sVar2 = strlen(__s);
      pcVar3 = pathname;
      if ((int)sVar2 < (int)sVar1) {
        pcVar3 = (char *)realloc(__s,(long)((int)sVar2 + 1));
        pathname = pcVar3;
      }
    }
  }
  return pcVar3;
}

Assistant:

char *
uplevel()
{
	register char *cptr;
	register int olen, nlen;

	if (!pathname)
		return (NULL);

	olen = strlen(pathname);
	cptr = pathname + olen - 1;
	while (cptr > pathname)
		if (*cptr == PATHSEP)
		{
			*cptr = '\0';
			break;
		}
		else
			cptr--;

	if (cptr == pathname)
	{
		free(pathname);
		pathname = NULL;
	}
	else
	{
		nlen = strlen(pathname);
		if (nlen < olen)
			pathname = realloc(pathname, nlen + 1);
	}
	return (pathname);
}